

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.cpp
# Opt level: O2

istream * operator>>(istream *is,half *h)

{
  float f;
  half local_1e;
  float local_1c;
  
  std::istream::_M_extract<float>((float *)is);
  half::half(&local_1e,local_1c);
  h->_h = (unsigned_short)local_1e;
  return is;
}

Assistant:

HALF_EXPORT istream &
operator >> (istream &is, half &h)
{
    float f;
    is >> f;
    h = half (f);
    return is;
}